

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_calc_usb_mul_h(DisasContext_conflict14 *ctx,TCGv_i32 arg_low,TCGv_i32 arg_high)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_add_i32(tcg_ctx,ret,arg_low,arg_low);
  tcg_gen_xor_i32(tcg_ctx,ret,ret,arg_low);
  tcg_gen_add_i32(tcg_ctx,tcg_ctx->cpu_PSW_AV,arg_high,arg_high);
  tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_PSW_AV,tcg_ctx->cpu_PSW_AV,arg_high);
  tcg_gen_or_i32(tcg_ctx,tcg_ctx->cpu_PSW_AV,tcg_ctx->cpu_PSW_AV,ret);
  tcg_gen_or_i32(tcg_ctx,tcg_ctx->cpu_PSW_SAV,tcg_ctx->cpu_PSW_SAV,tcg_ctx->cpu_PSW_AV);
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_PSW_V,0);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_calc_usb_mul_h(DisasContext *ctx, TCGv arg_low, TCGv arg_high)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    /* calc AV bit */
    tcg_gen_add_tl(tcg_ctx, temp, arg_low, arg_low);
    tcg_gen_xor_tl(tcg_ctx, temp, temp, arg_low);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, arg_high, arg_high);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, arg_high);
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, temp);
    /* calc SAV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
    tcg_temp_free(tcg_ctx, temp);
}